

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_AEAD_Chacha20Poly1305_Simd128.c
# Opt level: O3

void poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx,uint32_t len,uint8_t *text)

{
  Lib_IntVector_Intrinsics_vec128 *palVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  Lib_IntVector_Intrinsics_vec128 alVar27;
  ulong uVar28;
  ulong *puVar29;
  Lib_IntVector_Intrinsics_vec128 *acc;
  uint uVar30;
  uint8_t *text0;
  uint uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ulong uVar45;
  undefined1 auVar46 [16];
  ulong uVar49;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar60;
  ulong uVar61;
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar62 [16];
  ulong uVar65;
  undefined1 auVar66 [16];
  ulong uVar68;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  ulong uVar70;
  undefined1 auVar71 [16];
  ulong uVar72;
  ulong uVar73;
  undefined1 auVar74 [16];
  ulong uVar76;
  undefined1 auVar75 [16];
  ulong uVar77;
  ulong uVar78;
  uint8_t tmp [16];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_48 [16];
  
  uVar30 = len & 0xffffffe0;
  if (uVar30 != 0) {
    Hacl_MAC_Poly1305_Simd128_load_acc2(ctx,text);
    if (0x1f < len - 0x20) {
      uVar28 = (ulong)(len - 0x20 >> 5);
      uVar60 = ctx[0xf][0];
      uVar61 = ctx[0xf][1];
      uVar63 = ctx[0x10][0];
      uVar64 = ctx[0x10][1];
      uVar13 = ctx[0x11][0];
      uVar14 = ctx[0x11][1];
      uVar15 = ctx[0x12][0];
      uVar16 = ctx[0x12][1];
      uVar17 = ctx[0x13][0];
      uVar18 = ctx[0x13][1];
      uVar19 = ctx[0x15][0];
      uVar20 = ctx[0x15][1];
      uVar21 = ctx[0x16][0];
      uVar22 = ctx[0x16][1];
      uVar23 = ctx[0x17][0];
      uVar24 = ctx[0x17][1];
      alVar27 = ctx[0x17];
      uVar25 = ctx[0x18][0];
      uVar26 = ctx[0x18][1];
      uVar65 = (*ctx)[0];
      uVar68 = (*ctx)[1];
      uVar45 = ctx[1][0];
      uVar49 = ctx[1][1];
      uVar70 = ctx[2][0];
      uVar72 = ctx[2][1];
      uVar73 = ctx[3][0];
      uVar76 = ctx[3][1];
      uVar77 = ctx[4][0];
      uVar78 = ctx[4][1];
      puVar29 = (ulong *)(text + 0x30);
      do {
        uVar2 = puVar29[-2];
        uVar3 = puVar29[-1];
        uVar4 = *puVar29;
        uVar5 = puVar29[1];
        uStack_e0 = (undefined4)uVar4;
        uStack_dc = (undefined4)(uVar4 >> 0x20);
        auVar46._0_8_ =
             (uVar77 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar73 & 0xffffffff) * (uVar21 & 0xffffffff) +
             (uVar70 & 0xffffffff) * (uVar23 & 0xffffffff) +
             (uVar45 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (uVar60 & 0xffffffff);
        auVar46._8_8_ =
             (uVar78 & 0xffffffff) * (uVar20 & 0xffffffff) +
             (uVar76 & 0xffffffff) * (uVar22 & 0xffffffff) +
             (uVar72 & 0xffffffff) * (uVar24 & 0xffffffff) +
             (uVar49 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar68 & 0xffffffff) * (uVar61 & 0xffffffff);
        auVar40._0_8_ =
             (uVar77 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar73 & 0xffffffff) * (uVar60 & 0xffffffff) +
             (uVar70 & 0xffffffff) * (uVar63 & 0xffffffff) +
             (uVar45 & 0xffffffff) * (uVar13 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (uVar15 & 0xffffffff);
        auVar40._8_8_ =
             (uVar78 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar76 & 0xffffffff) * (uVar61 & 0xffffffff) +
             (uVar72 & 0xffffffff) * (uVar64 & 0xffffffff) +
             (uVar49 & 0xffffffff) * (uVar14 & 0xffffffff) +
             (uVar68 & 0xffffffff) * (uVar16 & 0xffffffff);
        auVar34._0_8_ = uVar2 >> 0x1a;
        auVar34._8_8_ = uVar4 >> 0x1a;
        auVar50 = pmovsxdq((undefined1  [16])alVar27,0x3ffffff03ffffff);
        auVar35._0_8_ =
             (auVar46._0_8_ >> 0x1a) +
             (uVar77 & 0xffffffff) * (uVar21 & 0xffffffff) +
             (uVar73 & 0xffffffff) * (uVar23 & 0xffffffff) +
             (uVar70 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar45 & 0xffffffff) * (uVar60 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (uVar63 & 0xffffffff);
        auVar35._8_8_ =
             (auVar46._8_8_ >> 0x1a) +
             (uVar78 & 0xffffffff) * (uVar22 & 0xffffffff) +
             (uVar76 & 0xffffffff) * (uVar24 & 0xffffffff) +
             (uVar72 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar49 & 0xffffffff) * (uVar61 & 0xffffffff) +
             (uVar68 & 0xffffffff) * (uVar64 & 0xffffffff);
        auVar57._0_8_ =
             (auVar40._0_8_ >> 0x1a) +
             (uVar77 & 0xffffffff) * (uVar60 & 0xffffffff) +
             (uVar73 & 0xffffffff) * (uVar63 & 0xffffffff) +
             (uVar70 & 0xffffffff) * (uVar13 & 0xffffffff) +
             (uVar45 & 0xffffffff) * (uVar15 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (uVar17 & 0xffffffff);
        auVar57._8_8_ =
             (auVar40._8_8_ >> 0x1a) +
             (uVar78 & 0xffffffff) * (uVar61 & 0xffffffff) +
             (uVar76 & 0xffffffff) * (uVar64 & 0xffffffff) +
             (uVar72 & 0xffffffff) * (uVar14 & 0xffffffff) +
             (uVar49 & 0xffffffff) * (uVar16 & 0xffffffff) +
             (uVar68 & 0xffffffff) * (uVar18 & 0xffffffff);
        auVar71._0_8_ =
             (auVar35._0_8_ >> 0x1a) +
             (uVar77 & 0xffffffff) * (uVar23 & 0xffffffff) +
             (uVar73 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar70 & 0xffffffff) * (uVar60 & 0xffffffff) +
             (uVar45 & 0xffffffff) * (uVar63 & 0xffffffff) +
             (uVar65 & 0xffffffff) * (uVar13 & 0xffffffff);
        auVar71._8_8_ =
             (auVar35._8_8_ >> 0x1a) +
             (uVar78 & 0xffffffff) * (uVar24 & 0xffffffff) +
             (uVar76 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar72 & 0xffffffff) * (uVar61 & 0xffffffff) +
             (uVar49 & 0xffffffff) * (uVar64 & 0xffffffff) +
             (uVar68 & 0xffffffff) * (uVar14 & 0xffffffff);
        auVar66._0_8_ = (auVar57._0_8_ >> 0x1a) * 5 + SUB168(auVar46 & auVar50,0);
        auVar66._8_8_ = (auVar57._8_8_ >> 0x1a) * 5 + SUB168(auVar46 & auVar50,8);
        in_XMM2 = auVar40 & auVar50;
        auVar74._0_8_ = (auVar71._0_8_ >> 0x1a) + in_XMM2._0_8_;
        auVar74._8_8_ = (auVar71._8_8_ >> 0x1a) + in_XMM2._8_8_;
        uVar45 = (auVar66._0_8_ >> 0x1a) + SUB168(auVar35 & auVar50,0) + SUB168(auVar34 & auVar50,0)
        ;
        uVar49 = (auVar66._8_8_ >> 0x1a) + SUB168(auVar35 & auVar50,8) + SUB168(auVar34 & auVar50,8)
        ;
        uVar70 = SUB168(auVar71 & auVar50,0) + ((uVar3 & 0x3fff) << 0xc | uVar2 >> 0x34);
        uVar72 = SUB168(auVar71 & auVar50,8) + ((uVar5 & 0x3fff) << 0xc | uVar4 >> 0x34);
        auVar41._8_4_ = uStack_e0;
        auVar41._0_8_ = uVar2;
        auVar41._12_4_ = uStack_dc;
        uVar65 = SUB168(auVar66 & auVar50,0) + SUB168(auVar41 & auVar50,0);
        uVar68 = SUB168(auVar66 & auVar50,8) + SUB168(auVar41 & auVar50,8);
        auVar69._0_8_ = uVar3 >> 0xe;
        auVar69._8_8_ = uVar5 >> 0xe;
        uVar73 = SUB168(auVar74 & auVar50,0) + SUB168(auVar69 & auVar50,0);
        uVar76 = SUB168(auVar74 & auVar50,8) + SUB168(auVar69 & auVar50,8);
        uVar77 = (auVar74._0_8_ >> 0x1a) + SUB168(auVar57 & auVar50,0) + (uVar3 >> 0x28) + 0x1000000
        ;
        uVar78 = (auVar74._8_8_ >> 0x1a) + SUB168(auVar57 & auVar50,8) + (uVar5 >> 0x28) + 0x1000000
        ;
        (*ctx)[0] = uVar65;
        (*ctx)[1] = uVar68;
        ctx[1][0] = uVar45;
        ctx[1][1] = uVar49;
        ctx[2][0] = uVar70;
        ctx[2][1] = uVar72;
        ctx[3][0] = uVar73;
        ctx[3][1] = uVar76;
        ctx[4][0] = uVar77;
        ctx[4][1] = uVar78;
        puVar29 = puVar29 + 4;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(ctx,ctx + 5);
  }
  if ((len & 0x10) != 0) {
    uVar6 = (uint)ctx[5][0];
    uVar7 = (uint)ctx[5][1];
    uVar8 = (uint)ctx[6][0];
    uVar9 = (uint)ctx[6][1];
    uVar10 = (uint)ctx[7][0];
    uVar11 = (uint)ctx[7][1];
    uVar12 = (uint)ctx[8][0];
    uVar56 = (uint)ctx[8][1];
    uVar45 = *(ulong *)(text + uVar30);
    uVar33 = (uint)(uVar45 >> 0x20);
    auVar50._8_4_ = (int)uVar45;
    auVar50._0_8_ = uVar45;
    auVar50._12_4_ = uVar33;
    uVar49 = *(ulong *)(text + (ulong)uVar30 + 8);
    uVar30 = (uint)(uVar49 >> 0x20);
    auVar36._8_4_ = (int)uVar49;
    auVar36._0_8_ = uVar49;
    auVar36._12_4_ = uVar30;
    auVar41 = pmovsxdq(in_XMM2,0x3ffffff03ffffff);
    auVar58._0_8_ = uVar45 >> 0x1a;
    auVar58._8_8_ = auVar50._8_8_ >> 0x1a;
    uVar72 = auVar36._8_8_;
    uVar60 = SUB168(auVar50 & auVar41,0) + (*ctx)[0];
    uVar63 = SUB168(auVar50 & auVar41,8) + (*ctx)[1];
    uVar77 = SUB168(auVar58 & auVar41,0) + ctx[1][0];
    uVar78 = SUB168(auVar58 & auVar41,8) + ctx[1][1];
    uVar73 = ((uVar49 & 0x3fff) << 0xc | (ulong)(uVar33 >> 0x14)) + ctx[2][0];
    uVar76 = ((uVar72 & 0x3fff) << 0xc | auVar50._8_8_ >> 0x34) + ctx[2][1];
    uVar45 = ctx[0xe][0];
    uVar65 = ctx[0xe][1];
    auVar59._0_8_ =
         (uVar77 & 0xffffffff) * (ulong)uVar12 + (uVar60 & 0xffffffff) * (ulong)(uint)ctx[9][0];
    auVar59._8_8_ =
         (uVar78 & 0xffffffff) * (ulong)uVar56 + (uVar63 & 0xffffffff) * (ulong)(uint)ctx[9][1];
    uVar61 = (uVar49 >> 0xe & 0x3ffffff) + ctx[3][0];
    uVar64 = (uVar72 >> 0xe & 0x3ffffff) + ctx[3][1];
    uVar49 = ctx[0xd][0];
    uVar68 = ctx[0xd][1];
    uVar70 = (ulong)(uVar30 >> 8) + ctx[4][0] + 0x1000000;
    uVar72 = (uVar72 >> 0x28) + ctx[4][1] + 0x1000000;
    auVar53._0_8_ =
         (ctx[0xb][0] & 0xffffffffU) * (uVar70 & 0xffffffff) +
         (uVar61 & 0xffffffff) * (ctx[0xc][0] & 0xffffffffU) +
         (uVar77 & 0xffffffff) * (uVar45 & 0xffffffff) + (uVar60 & 0xffffffff) * (ulong)uVar6 +
         (uVar73 & 0xffffffff) * (uVar49 & 0xffffffff);
    auVar53._8_8_ =
         (ctx[0xb][1] & 0xffffffffU) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (ctx[0xc][1] & 0xffffffffU) +
         (uVar78 & 0xffffffff) * (uVar65 & 0xffffffff) + (uVar63 & 0xffffffff) * (ulong)uVar7 +
         (uVar76 & 0xffffffff) * (uVar68 & 0xffffffff);
    auVar67._0_8_ =
         (uVar45 & 0xffffffff) * (uVar70 & 0xffffffff) +
         (uVar61 & 0xffffffff) * (ulong)uVar6 +
         (uVar77 & 0xffffffff) * (ulong)uVar10 + (uVar60 & 0xffffffff) * (ulong)uVar12 +
         (uVar73 & 0xffffffff) * (ulong)uVar8;
    auVar67._8_8_ =
         (uVar65 & 0xffffffff) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (ulong)uVar7 +
         (uVar78 & 0xffffffff) * (ulong)uVar11 + (uVar63 & 0xffffffff) * (ulong)uVar56 +
         (uVar76 & 0xffffffff) * (ulong)uVar9;
    auVar31._0_8_ =
         (auVar53._0_8_ >> 0x1a) +
         (ctx[0xc][0] & 0xffffffffU) * (uVar70 & 0xffffffff) +
         (uVar61 & 0xffffffff) * (uVar49 & 0xffffffff) +
         (uVar77 & 0xffffffff) * (ulong)uVar6 + (uVar60 & 0xffffffff) * (ulong)uVar8 +
         (uVar73 & 0xffffffff) * (uVar45 & 0xffffffff);
    auVar31._8_8_ =
         (auVar53._8_8_ >> 0x1a) +
         (ctx[0xc][1] & 0xffffffffU) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (uVar68 & 0xffffffff) +
         (uVar78 & 0xffffffff) * (ulong)uVar7 + (uVar63 & 0xffffffff) * (ulong)uVar9 +
         (uVar76 & 0xffffffff) * (uVar65 & 0xffffffff);
    auVar47._0_8_ =
         (auVar67._0_8_ >> 0x1a) +
         (uVar70 & 0xffffffff) * (ulong)uVar6 + (uVar61 & 0xffffffff) * (ulong)uVar8 + auVar59._0_8_
         + (uVar73 & 0xffffffff) * (ulong)uVar10;
    auVar47._8_8_ =
         (auVar67._8_8_ >> 0x1a) +
         (uVar72 & 0xffffffff) * (ulong)uVar7 + (uVar64 & 0xffffffff) * (ulong)uVar9 + auVar59._8_8_
         + (uVar76 & 0xffffffff) * (ulong)uVar11;
    auVar41 = pmovsxdq(auVar59,0x3ffffff03ffffff);
    auVar37._0_8_ =
         (auVar31._0_8_ >> 0x1a) +
         (uVar49 & 0xffffffff) * (uVar70 & 0xffffffff) +
         (uVar61 & 0xffffffff) * (uVar45 & 0xffffffff) +
         (uVar77 & 0xffffffff) * (ulong)uVar8 + (uVar60 & 0xffffffff) * (ulong)uVar10 +
         (uVar73 & 0xffffffff) * (ulong)uVar6;
    auVar37._8_8_ =
         (auVar31._8_8_ >> 0x1a) +
         (uVar68 & 0xffffffff) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (uVar65 & 0xffffffff) +
         (uVar78 & 0xffffffff) * (ulong)uVar9 + (uVar63 & 0xffffffff) * (ulong)uVar11 +
         (uVar76 & 0xffffffff) * (ulong)uVar7;
    auVar42._0_8_ = (auVar47._0_8_ >> 0x1a) * 5 + SUB168(auVar53 & auVar41,0);
    auVar42._8_8_ = (auVar47._8_8_ >> 0x1a) * 5 + SUB168(auVar53 & auVar41,8);
    auVar51._0_8_ = (auVar37._0_8_ >> 0x1a) + SUB168(auVar67 & auVar41,0);
    auVar51._8_8_ = (auVar37._8_8_ >> 0x1a) + SUB168(auVar67 & auVar41,8);
    *ctx = (Lib_IntVector_Intrinsics_vec128)(auVar42 & auVar41);
    ctx[1][0] = (auVar42._0_8_ >> 0x1a) + SUB168(auVar31 & auVar41,0);
    ctx[1][1] = (auVar42._8_8_ >> 0x1a) + SUB168(auVar31 & auVar41,8);
    ctx[2] = (Lib_IntVector_Intrinsics_vec128)(auVar37 & auVar41);
    ctx[3] = (Lib_IntVector_Intrinsics_vec128)(auVar51 & auVar41);
    ctx[4][0] = (auVar51._0_8_ >> 0x1a) + SUB168(auVar47 & auVar41,0);
    ctx[4][1] = (auVar51._8_8_ >> 0x1a) + SUB168(auVar47 & auVar41,8);
  }
  local_48 = (undefined1  [16])0x0;
  memcpy(local_48,text + (len & 0xfffffff0),(ulong)(len & 0xf));
  if ((len & 0xf) != 0) {
    auVar43._0_8_ = local_48._0_8_;
    auVar43._8_4_ = local_48._0_4_;
    auVar43._12_4_ = local_48._4_4_;
    auVar38._0_8_ = local_48._8_8_;
    auVar38._8_4_ = local_48._8_4_;
    auVar38._12_4_ = local_48._12_4_;
    auVar41 = pmovsxdq(local_48,0x3ffffff03ffffff);
    auVar54._0_8_ = auVar43._0_8_ >> 0x1a;
    auVar54._8_8_ = auVar43._8_8_ >> 0x1a;
    uVar72 = auVar38._8_8_;
    uVar30 = (uint)ctx[5][0];
    uVar6 = (uint)ctx[5][1];
    palVar1 = ctx + 6;
    uVar7 = (uint)(*palVar1)[0];
    uVar8 = (uint)ctx[6][1];
    uVar9 = (uint)ctx[7][0];
    uVar10 = (uint)ctx[7][1];
    uVar11 = (uint)ctx[8][0];
    uVar12 = (uint)ctx[8][1];
    uVar60 = SUB168(auVar43 & auVar41,0) + (*ctx)[0];
    uVar61 = SUB168(auVar43 & auVar41,8) + (*ctx)[1];
    uVar77 = SUB168(auVar54 & auVar41,0) + ctx[1][0];
    uVar78 = SUB168(auVar54 & auVar41,8) + ctx[1][1];
    uVar73 = ((auVar38._0_8_ & 0x3fff) << 0xc | (ulong)(local_48._4_4_ >> 0x14)) + ctx[2][0];
    uVar76 = ((uVar72 & 0x3fff) << 0xc | auVar43._8_8_ >> 0x34) + ctx[2][1];
    uVar45 = ctx[0xe][0];
    uVar49 = ctx[0xe][1];
    auVar62._0_8_ = auVar38._0_8_ >> 0xe;
    auVar62._8_8_ = uVar72 >> 0xe;
    uVar63 = SUB168(auVar62 & auVar41,0) + ctx[3][0];
    uVar64 = SUB168(auVar62 & auVar41,8) + ctx[3][1];
    uVar65 = ctx[0xd][0];
    uVar68 = ctx[0xd][1];
    uVar56 = SUB124(*(undefined1 (*) [12])*palVar1,0);
    uVar33 = SUB124(*(undefined1 (*) [12])*palVar1,8);
    uVar70 = (ulong)(local_48._12_4_ >> 8) + ctx[4][0] + 0x1000000;
    uVar72 = (uVar72 >> 0x28) + ctx[4][1] + 0x1000000;
    auVar55._0_8_ =
         (ctx[0xb][0] & 0xffffffffU) * (uVar70 & 0xffffffff) +
         (uVar63 & 0xffffffff) * (ctx[0xc][0] & 0xffffffffU) +
         (uVar77 & 0xffffffff) * (uVar45 & 0xffffffff) + (uVar60 & 0xffffffff) * (ulong)uVar30 +
         (uVar73 & 0xffffffff) * (uVar65 & 0xffffffff);
    auVar55._8_8_ =
         (ctx[0xb][1] & 0xffffffffU) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (ctx[0xc][1] & 0xffffffffU) +
         (uVar78 & 0xffffffff) * (uVar49 & 0xffffffff) + (uVar61 & 0xffffffff) * (ulong)uVar6 +
         (uVar76 & 0xffffffff) * (uVar68 & 0xffffffff);
    auVar75._0_8_ =
         (uVar45 & 0xffffffff) * (uVar70 & 0xffffffff) +
         (uVar63 & 0xffffffff) * (ulong)uVar30 +
         (uVar77 & 0xffffffff) * (ulong)uVar9 + (uVar60 & 0xffffffff) * (ulong)uVar11 +
         (uVar73 & 0xffffffff) * (ulong)uVar56;
    auVar75._8_8_ =
         (uVar49 & 0xffffffff) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (ulong)uVar6 +
         (uVar78 & 0xffffffff) * (ulong)uVar10 + (uVar61 & 0xffffffff) * (ulong)uVar12 +
         (uVar76 & 0xffffffff) * (ulong)uVar33;
    auVar32._0_8_ =
         (auVar55._0_8_ >> 0x1a) +
         (ctx[0xc][0] & 0xffffffffU) * (uVar70 & 0xffffffff) +
         (uVar63 & 0xffffffff) * (uVar65 & 0xffffffff) +
         (uVar77 & 0xffffffff) * (ulong)uVar30 + (uVar60 & 0xffffffff) * (ulong)uVar7 +
         (uVar73 & 0xffffffff) * (uVar45 & 0xffffffff);
    auVar32._8_8_ =
         (auVar55._8_8_ >> 0x1a) +
         (ctx[0xc][1] & 0xffffffffU) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (uVar68 & 0xffffffff) +
         (uVar78 & 0xffffffff) * (ulong)uVar6 + (uVar61 & 0xffffffff) * (ulong)uVar8 +
         (uVar76 & 0xffffffff) * (uVar49 & 0xffffffff);
    auVar48._0_8_ =
         (auVar75._0_8_ >> 0x1a) +
         (uVar70 & 0xffffffff) * (ulong)uVar30 +
         (uVar63 & 0xffffffff) * (ulong)uVar56 +
         (uVar77 & 0xffffffff) * (ulong)uVar11 + (uVar60 & 0xffffffff) * (ulong)(uint)ctx[9][0] +
         (uVar73 & 0xffffffff) * (ulong)uVar9;
    auVar48._8_8_ =
         (auVar75._8_8_ >> 0x1a) +
         (uVar72 & 0xffffffff) * (ulong)uVar6 +
         (uVar64 & 0xffffffff) * (ulong)uVar33 +
         (uVar78 & 0xffffffff) * (ulong)uVar12 + (uVar61 & 0xffffffff) * (ulong)(uint)ctx[9][1] +
         (uVar76 & 0xffffffff) * (ulong)uVar10;
    auVar41 = pmovsxdq((undefined1  [16])*palVar1,0x3ffffff03ffffff);
    auVar39._0_8_ =
         (auVar32._0_8_ >> 0x1a) +
         (uVar65 & 0xffffffff) * (uVar70 & 0xffffffff) +
         (uVar63 & 0xffffffff) * (uVar45 & 0xffffffff) +
         (uVar77 & 0xffffffff) * (ulong)uVar7 + (uVar60 & 0xffffffff) * (ulong)uVar9 +
         (uVar73 & 0xffffffff) * (ulong)uVar30;
    auVar39._8_8_ =
         (auVar32._8_8_ >> 0x1a) +
         (uVar68 & 0xffffffff) * (uVar72 & 0xffffffff) +
         (uVar64 & 0xffffffff) * (uVar49 & 0xffffffff) +
         (uVar78 & 0xffffffff) * (ulong)uVar8 + (uVar61 & 0xffffffff) * (ulong)uVar10 +
         (uVar76 & 0xffffffff) * (ulong)uVar6;
    auVar44._0_8_ = (auVar48._0_8_ >> 0x1a) * 5 + SUB168(auVar55 & auVar41,0);
    auVar44._8_8_ = (auVar48._8_8_ >> 0x1a) * 5 + SUB168(auVar55 & auVar41,8);
    auVar52._0_8_ = (auVar39._0_8_ >> 0x1a) + SUB168(auVar75 & auVar41,0);
    auVar52._8_8_ = (auVar39._8_8_ >> 0x1a) + SUB168(auVar75 & auVar41,8);
    *ctx = (Lib_IntVector_Intrinsics_vec128)(auVar44 & auVar41);
    ctx[1][0] = (auVar44._0_8_ >> 0x1a) + SUB168(auVar32 & auVar41,0);
    ctx[1][1] = (auVar44._8_8_ >> 0x1a) + SUB168(auVar32 & auVar41,8);
    ctx[2] = (Lib_IntVector_Intrinsics_vec128)(auVar39 & auVar41);
    ctx[3] = (Lib_IntVector_Intrinsics_vec128)(auVar52 & auVar41);
    ctx[4][0] = (auVar52._0_8_ >> 0x1a) + SUB168(auVar48 & auVar41,0);
    ctx[4][1] = (auVar52._8_8_ >> 0x1a) + SUB168(auVar48 & auVar41,8);
  }
  return;
}

Assistant:

static inline void
poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx, uint32_t len, uint8_t *text)
{
  uint32_t n = len / 16U;
  uint32_t r = len % 16U;
  uint8_t *blocks = text;
  uint8_t *rem = text + n * 16U;
  Lib_IntVector_Intrinsics_vec128 *pre0 = ctx + 5U;
  Lib_IntVector_Intrinsics_vec128 *acc0 = ctx;
  uint32_t sz_block = 32U;
  uint32_t len0 = n * 16U / sz_block * sz_block;
  uint8_t *t00 = blocks;
  if (len0 > 0U)
  {
    uint32_t bs = 32U;
    uint8_t *text0 = t00;
    Hacl_MAC_Poly1305_Simd128_load_acc2(acc0, text0);
    uint32_t len1 = len0 - bs;
    uint8_t *text1 = t00 + bs;
    uint32_t nb = len1 / bs;
    for (uint32_t i = 0U; i < nb; i++)
    {
      uint8_t *block = text1 + i * bs;
      KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
      Lib_IntVector_Intrinsics_vec128 b1 = Lib_IntVector_Intrinsics_vec128_load64_le(block);
      Lib_IntVector_Intrinsics_vec128 b2 = Lib_IntVector_Intrinsics_vec128_load64_le(block + 16U);
      Lib_IntVector_Intrinsics_vec128 lo = Lib_IntVector_Intrinsics_vec128_interleave_low64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      hi = Lib_IntVector_Intrinsics_vec128_interleave_high64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      f00 =
        Lib_IntVector_Intrinsics_vec128_and(lo,
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f15 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 26U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f25 =
        Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 52U),
          Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(hi,
              Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
            12U));
      Lib_IntVector_Intrinsics_vec128
      f30 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 14U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 40U);
      Lib_IntVector_Intrinsics_vec128 f0 = f00;
      Lib_IntVector_Intrinsics_vec128 f1 = f15;
      Lib_IntVector_Intrinsics_vec128 f2 = f25;
      Lib_IntVector_Intrinsics_vec128 f3 = f30;
      Lib_IntVector_Intrinsics_vec128 f41 = f40;
      e[0U] = f0;
      e[1U] = f1;
      e[2U] = f2;
      e[3U] = f3;
      e[4U] = f41;
      uint64_t b = 0x1000000ULL;
      Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
      Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
      e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
      Lib_IntVector_Intrinsics_vec128 *rn = pre0 + 10U;
      Lib_IntVector_Intrinsics_vec128 *rn5 = pre0 + 15U;
      Lib_IntVector_Intrinsics_vec128 r0 = rn[0U];
      Lib_IntVector_Intrinsics_vec128 r1 = rn[1U];
      Lib_IntVector_Intrinsics_vec128 r2 = rn[2U];
      Lib_IntVector_Intrinsics_vec128 r3 = rn[3U];
      Lib_IntVector_Intrinsics_vec128 r4 = rn[4U];
      Lib_IntVector_Intrinsics_vec128 r51 = rn5[1U];
      Lib_IntVector_Intrinsics_vec128 r52 = rn5[2U];
      Lib_IntVector_Intrinsics_vec128 r53 = rn5[3U];
      Lib_IntVector_Intrinsics_vec128 r54 = rn5[4U];
      Lib_IntVector_Intrinsics_vec128 f10 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f110 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f120 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f130 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f140 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 a0 = Lib_IntVector_Intrinsics_vec128_mul64(r0, f10);
      Lib_IntVector_Intrinsics_vec128 a1 = Lib_IntVector_Intrinsics_vec128_mul64(r1, f10);
      Lib_IntVector_Intrinsics_vec128 a2 = Lib_IntVector_Intrinsics_vec128_mul64(r2, f10);
      Lib_IntVector_Intrinsics_vec128 a3 = Lib_IntVector_Intrinsics_vec128_mul64(r3, f10);
      Lib_IntVector_Intrinsics_vec128 a4 = Lib_IntVector_Intrinsics_vec128_mul64(r4, f10);
      Lib_IntVector_Intrinsics_vec128
      a01 =
        Lib_IntVector_Intrinsics_vec128_add64(a0,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f110));
      Lib_IntVector_Intrinsics_vec128
      a11 =
        Lib_IntVector_Intrinsics_vec128_add64(a1,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f110));
      Lib_IntVector_Intrinsics_vec128
      a21 =
        Lib_IntVector_Intrinsics_vec128_add64(a2,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f110));
      Lib_IntVector_Intrinsics_vec128
      a31 =
        Lib_IntVector_Intrinsics_vec128_add64(a3,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f110));
      Lib_IntVector_Intrinsics_vec128
      a41 =
        Lib_IntVector_Intrinsics_vec128_add64(a4,
          Lib_IntVector_Intrinsics_vec128_mul64(r3, f110));
      Lib_IntVector_Intrinsics_vec128
      a02 =
        Lib_IntVector_Intrinsics_vec128_add64(a01,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f120));
      Lib_IntVector_Intrinsics_vec128
      a12 =
        Lib_IntVector_Intrinsics_vec128_add64(a11,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f120));
      Lib_IntVector_Intrinsics_vec128
      a22 =
        Lib_IntVector_Intrinsics_vec128_add64(a21,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f120));
      Lib_IntVector_Intrinsics_vec128
      a32 =
        Lib_IntVector_Intrinsics_vec128_add64(a31,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f120));
      Lib_IntVector_Intrinsics_vec128
      a42 =
        Lib_IntVector_Intrinsics_vec128_add64(a41,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f120));
      Lib_IntVector_Intrinsics_vec128
      a03 =
        Lib_IntVector_Intrinsics_vec128_add64(a02,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f130));
      Lib_IntVector_Intrinsics_vec128
      a13 =
        Lib_IntVector_Intrinsics_vec128_add64(a12,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f130));
      Lib_IntVector_Intrinsics_vec128
      a23 =
        Lib_IntVector_Intrinsics_vec128_add64(a22,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f130));
      Lib_IntVector_Intrinsics_vec128
      a33 =
        Lib_IntVector_Intrinsics_vec128_add64(a32,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f130));
      Lib_IntVector_Intrinsics_vec128
      a43 =
        Lib_IntVector_Intrinsics_vec128_add64(a42,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f130));
      Lib_IntVector_Intrinsics_vec128
      a04 =
        Lib_IntVector_Intrinsics_vec128_add64(a03,
          Lib_IntVector_Intrinsics_vec128_mul64(r51, f140));
      Lib_IntVector_Intrinsics_vec128
      a14 =
        Lib_IntVector_Intrinsics_vec128_add64(a13,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f140));
      Lib_IntVector_Intrinsics_vec128
      a24 =
        Lib_IntVector_Intrinsics_vec128_add64(a23,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f140));
      Lib_IntVector_Intrinsics_vec128
      a34 =
        Lib_IntVector_Intrinsics_vec128_add64(a33,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f140));
      Lib_IntVector_Intrinsics_vec128
      a44 =
        Lib_IntVector_Intrinsics_vec128_add64(a43,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f140));
      Lib_IntVector_Intrinsics_vec128 t01 = a04;
      Lib_IntVector_Intrinsics_vec128 t1 = a14;
      Lib_IntVector_Intrinsics_vec128 t2 = a24;
      Lib_IntVector_Intrinsics_vec128 t3 = a34;
      Lib_IntVector_Intrinsics_vec128 t4 = a44;
      Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
      Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
      Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
      Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
      Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
      Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
      Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
      Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
      Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
      Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
      Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
      Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
      Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
      Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
      Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
      Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
      Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
      Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
      Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
      Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
      Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
      Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
      Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
      Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
      Lib_IntVector_Intrinsics_vec128 o00 = x02;
      Lib_IntVector_Intrinsics_vec128 o10 = x12;
      Lib_IntVector_Intrinsics_vec128 o20 = x21;
      Lib_IntVector_Intrinsics_vec128 o30 = x32;
      Lib_IntVector_Intrinsics_vec128 o40 = x42;
      acc0[0U] = o00;
      acc0[1U] = o10;
      acc0[2U] = o20;
      acc0[3U] = o30;
      acc0[4U] = o40;
      Lib_IntVector_Intrinsics_vec128 f100 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f11 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f12 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f13 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f14 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 f20 = e[0U];
      Lib_IntVector_Intrinsics_vec128 f21 = e[1U];
      Lib_IntVector_Intrinsics_vec128 f22 = e[2U];
      Lib_IntVector_Intrinsics_vec128 f23 = e[3U];
      Lib_IntVector_Intrinsics_vec128 f24 = e[4U];
      Lib_IntVector_Intrinsics_vec128 o0 = Lib_IntVector_Intrinsics_vec128_add64(f100, f20);
      Lib_IntVector_Intrinsics_vec128 o1 = Lib_IntVector_Intrinsics_vec128_add64(f11, f21);
      Lib_IntVector_Intrinsics_vec128 o2 = Lib_IntVector_Intrinsics_vec128_add64(f12, f22);
      Lib_IntVector_Intrinsics_vec128 o3 = Lib_IntVector_Intrinsics_vec128_add64(f13, f23);
      Lib_IntVector_Intrinsics_vec128 o4 = Lib_IntVector_Intrinsics_vec128_add64(f14, f24);
      acc0[0U] = o0;
      acc0[1U] = o1;
      acc0[2U] = o2;
      acc0[3U] = o3;
      acc0[4U] = o4;
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(acc0, pre0);
  }
  uint32_t len1 = n * 16U - len0;
  uint8_t *t10 = blocks + len0;
  uint32_t nb = len1 / 16U;
  uint32_t rem1 = len1 % 16U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *block = t10 + i * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(block);
    uint64_t lo = u0;
    uint64_t u = load64_le(block + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  if (rem1 > 0U)
  {
    uint8_t *last = t10 + nb * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint8_t tmp[16U] = { 0U };
    memcpy(tmp, last, rem1 * sizeof (uint8_t));
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f4 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f4;
    uint64_t b = 1ULL << rem1 * 8U % 26U;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 fi = e[rem1 * 8U / 26U];
    e[rem1 * 8U / 26U] = Lib_IntVector_Intrinsics_vec128_or(fi, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  uint8_t tmp[16U] = { 0U };
  memcpy(tmp, rem, r * sizeof (uint8_t));
  if (r > 0U)
  {
    Lib_IntVector_Intrinsics_vec128 *pre = ctx + 5U;
    Lib_IntVector_Intrinsics_vec128 *acc = ctx;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t0 = a06;
    Lib_IntVector_Intrinsics_vec128 t1 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t0, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t0, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc[0U] = o0;
    acc[1U] = o1;
    acc[2U] = o2;
    acc[3U] = o3;
    acc[4U] = o4;
    return;
  }
}